

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fix-qdf.cc
# Opt level: O3

void __thiscall QdfFixer::adjustOstreamXref(QdfFixer *this)

{
  int iVar1;
  ulong i;
  pointer pQVar2;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined4 local_28;
  
  iVar1 = this->ostream_id;
  i = this->ostream_idx;
  this->ostream_idx = i + 1;
  if ((i & 0xffffffff80000000) != 0) {
    QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(i);
  }
  QPDFXRefEntry::QPDFXRefEntry((QPDFXRefEntry *)&local_38,2,(long)iVar1,(int)i);
  pQVar2 = (this->xref).super__Vector_base<QPDFXRefEntry,_std::allocator<QPDFXRefEntry>_>._M_impl.
           super__Vector_impl_data._M_finish;
  *(undefined4 *)(pQVar2 + -8) = local_28;
  *(undefined8 *)(pQVar2 + -0x18) = local_38;
  *(undefined8 *)(pQVar2 + -0x10) = uStack_30;
  return;
}

Assistant:

void
QdfFixer::adjustOstreamXref()
{
    xref.back() = QPDFXRefEntry(2, ostream_id, QIntC::to_int(ostream_idx++));
}